

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

void dasm_put(BuildCtx *ctx,int start,...)

{
  long lVar1;
  int iVar2;
  char in_AL;
  byte bVar3;
  void *pvVar4;
  int *piVar5;
  undefined8 in_RCX;
  byte *pbVar6;
  undefined8 in_RDX;
  int in_ESI;
  uint uVar7;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *pb;
  int n_1;
  int *pl;
  int n;
  int action;
  size_t _need;
  size_t _sz;
  int *b;
  int mrm;
  int ofs;
  int pos;
  dasm_Section *sec;
  dasm_ActList p;
  dasm_State *D;
  va_list ap;
  uint *local_1a8;
  uint *local_188;
  uint *local_150;
  uint local_138 [4];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  int local_7c;
  int *local_78;
  uint local_70;
  ulong local_68;
  size_t local_60;
  uint local_4c;
  int local_48;
  uint local_44;
  long *local_40;
  byte *local_38;
  long local_30;
  uint local_28;
  uint *local_20;
  int local_c;
  long *local_8;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_30 = *in_RDI;
  local_38 = (byte *)(*(long *)(local_30 + 8) + (long)in_ESI);
  local_40 = *(long **)(local_30 + 0x38);
  local_44 = *(uint *)(local_40 + 3);
  local_48 = (int)local_40[4];
  local_4c = 0xffffffff;
  local_c = in_ESI;
  if (*(int *)((long)local_40 + 0x1c) <= (int)local_44) {
    local_60 = local_40[2];
    local_68 = local_40[2] + 200;
    if (local_60 < local_68) {
      if (local_60 < 0x10) {
        local_60 = 0x10;
      }
      for (; local_60 < local_68; local_60 = local_60 * 2) {
      }
      local_128 = in_RDX;
      local_120 = in_RCX;
      local_118 = in_R8;
      local_110 = in_R9;
      local_8 = in_RDI;
      pvVar4 = realloc((void *)local_40[1],local_60);
      local_40[1] = (long)pvVar4;
      if (local_40[1] == 0) {
        exit(1);
      }
      local_40[2] = local_60;
    }
    *local_40 = local_40[1] + (ulong)(local_44 & 0xff000000) * -4;
    *(uint *)((long)local_40 + 0x1c) =
         (int)((ulong)(long)(int)local_40[2] >> 2) + -0x19 + (local_44 & 0xff000000);
  }
  lVar1 = *local_40;
  *(int *)(lVar1 + (long)(int)local_44 * 4) = local_c;
  local_20 = (uint *)&stack0x00000008;
  local_28 = 0x10;
  uVar7 = local_44 + 1;
  pbVar6 = local_38;
switchD_00105fbc_default:
  while( true ) {
    local_38 = pbVar6;
    local_44 = uVar7;
    pbVar6 = local_38 + 1;
    bVar3 = *local_38;
    uVar7 = local_44;
    if (0xe8 < bVar3) break;
    local_48 = local_48 + 1;
  }
  iVar2 = (int)pbVar6;
  if (0xf3 < bVar3) goto code_r0x00105fa9;
  if (local_28 < 0x29) {
    local_150 = (uint *)((long)local_138 + (long)(int)local_28);
    local_28 = local_28 + 8;
  }
  else {
    local_150 = local_20;
    local_20 = local_20 + 2;
  }
  local_70 = *local_150;
  uVar7 = local_44 + 1;
  *(uint *)(lVar1 + (long)(int)local_44 * 4) = local_70;
  switch(bVar3) {
  case 0xe9:
    if (local_70 == 0) {
      if ((int)local_4c < 0) {
        local_4c = (uint)local_38[-1];
      }
      if ((local_4c & 7) != 5) break;
    }
  case 0xef:
    if ((local_70 + 0x80 & 0xffffff00) == 0) goto LAB_00105d0c;
switchD_00105bff_caseD_ed:
    local_48 = local_48 + 4;
    break;
  case 0xea:
    if ((local_70 + 0x80 & 0xffffff00) != 0) {
      *(uint *)(local_30 + 0x4c) = (iVar2 - (int)*(undefined8 *)(local_30 + 8)) - 1U | 0x11000000;
      return;
    }
    goto LAB_00105d0c;
  case 0xeb:
    if ((local_70 & 0xffffff00) != 0) {
      *(uint *)(local_30 + 0x4c) = (iVar2 - (int)*(undefined8 *)(local_30 + 8)) - 1U | 0x11000000;
      return;
    }
    goto LAB_00105d0c;
  case 0xec:
LAB_00105d3e:
    if ((local_70 & 0xffff0000) != 0) {
      *(uint *)(local_30 + 0x4c) = (iVar2 - (int)*(undefined8 *)(local_30 + 8)) - 1U | 0x11000000;
      return;
    }
    local_48 = local_48 + 2;
    break;
  case 0xed:
  case 0xf3:
    goto switchD_00105bff_caseD_ed;
  case 0xee:
    if ((local_70 + 0x80 & 0xffffff00) != 0) goto LAB_00105d3e;
LAB_00105d0c:
    local_48 = local_48 + 1;
    break;
  case 0xf0:
    if (((local_70 & 0xfffffff0) != 0) || ((local_70 == 4 && ((int)(uint)*pbVar6 >> 5 == 2)))) {
      *(uint *)(local_30 + 0x4c) = (iVar2 - (int)*(undefined8 *)(local_30 + 8)) - 1U | 0x15000000;
      return;
    }
    if ((*pbVar6 < 0x40) && (local_38[2] == 0xe9)) {
      local_4c = local_70;
    }
    if ((*pbVar6 < 0x20) && ((local_70 & 7) == 4)) {
      local_48 = local_48 + 1;
    }
    local_38 = local_38 + 2;
    bVar3 = *pbVar6 >> 3 & 3;
    if (bVar3 != 1) {
      if (bVar3 != 2) {
        pbVar6 = local_38;
        if (bVar3 != 3) goto switchD_00105fbc_default;
        local_70 = *(uint *)(lVar1 + (long)(int)(local_44 + -2) * 4) | local_70;
      }
      local_70 = *(uint *)(lVar1 + (long)(int)(local_44 + -1) * 4) | local_70;
    }
    pbVar6 = local_38;
    if ((int)local_70 < 8) {
      *(uint *)(lVar1 + (long)(int)local_44 * 4) = *(uint *)(lVar1 + (long)(int)local_44 * 4) | 0x10
      ;
      local_48 = local_48 + -1;
    }
    goto switchD_00105fbc_default;
  case 0xf1:
    local_48 = local_70 + local_48;
    pbVar6 = local_38 + 2;
    break;
  case 0xf2:
    *(undefined4 *)(lVar1 + (long)(int)(local_44 + -1) * 4) = 0xc0000000;
  }
  local_38 = pbVar6;
  local_4c = 0xffffffff;
  pbVar6 = local_38;
  goto switchD_00105fbc_default;
code_r0x00105fa9:
  switch(bVar3) {
  case 0xf4:
  case 0xf6:
    local_38 = local_38 + 2;
    uVar7 = (uint)*pbVar6;
    local_78 = (int *)(*(long *)(local_30 + 0x10) + (long)(int)uVar7 * 4);
    if (uVar7 < 0xf7) {
      if ((uVar7 < 10) && (-1 < *local_78)) {
        *(uint *)(local_30 + 0x4c) =
             ((int)local_38 - (int)*(undefined8 *)(local_30 + 8)) - 1U | 0x13000000;
        return;
      }
      if (*(ulong *)(local_30 + 0x18) <= (ulong)((long)local_78 - *(long *)(local_30 + 0x10))) {
        *(uint *)(local_30 + 0x4c) =
             ((int)local_38 - (int)*(undefined8 *)(local_30 + 8)) - 1U | 0x13000000;
        return;
      }
      goto LAB_001061de;
    }
    local_78 = local_78 + -0xf6;
    local_7c = *local_78;
    if (local_7c < 0) {
      local_7c = 0;
    }
    break;
  case 0xf5:
  case 0xf7:
    if (local_28 < 0x29) {
      local_188 = (uint *)((long)local_138 + (long)(int)local_28);
      local_28 = local_28 + 8;
    }
    else {
      local_188 = local_20;
      local_20 = local_20 + 2;
    }
    local_78 = (int *)(*(long *)(local_30 + 0x20) + (long)(int)*local_188 * 4);
    local_38 = pbVar6;
    if (*(ulong *)(local_30 + 0x28) <= (ulong)((long)local_78 - *(long *)(local_30 + 0x20))) {
      *(uint *)(local_30 + 0x4c) = (iVar2 - (int)*(undefined8 *)(local_30 + 8)) - 1U | 0x14000000;
      return;
    }
LAB_001061de:
    local_7c = *local_78;
    if (local_7c < 0) {
      *(int *)(lVar1 + (long)(int)local_44 * 4) = -local_7c;
      goto LAB_00106244;
    }
    break;
  case 0xf8:
    local_38 = local_38 + 2;
    local_78 = (int *)(*(long *)(local_30 + 0x10) + (long)(int)(uint)*pbVar6 * 4);
    if (*(ulong *)(local_30 + 0x18) <= (ulong)((long)local_78 - *(long *)(local_30 + 0x10))) {
      *(uint *)(local_30 + 0x4c) =
           ((int)local_38 - (int)*(undefined8 *)(local_30 + 8)) - 1U | 0x13000000;
      return;
    }
    goto LAB_0010641c;
  case 0xf9:
    if (local_28 < 0x29) {
      local_1a8 = (uint *)((long)local_138 + (long)(int)local_28);
      local_28 = local_28 + 8;
    }
    else {
      local_1a8 = local_20;
      local_20 = local_20 + 2;
    }
    local_78 = (int *)(*(long *)(local_30 + 0x20) + (long)(int)*local_1a8 * 4);
    local_38 = pbVar6;
    if (*(ulong *)(local_30 + 0x28) <= (ulong)((long)local_78 - *(long *)(local_30 + 0x20))) {
      *(uint *)(local_30 + 0x4c) = (iVar2 - (int)*(undefined8 *)(local_30 + 8)) - 1U | 0x14000000;
      return;
    }
LAB_0010641c:
    local_7c = *local_78;
    while (0 < local_7c) {
      piVar5 = (int *)(*(long *)(local_30 + 0x50 + (long)(local_7c >> 0x18) * 0x28) +
                      (long)local_7c * 4);
      local_7c = *piVar5;
      *piVar5 = local_44;
    }
    *local_78 = -local_44;
    *(int *)(lVar1 + (long)(int)local_44 * 4) = local_48;
    uVar7 = local_44 + 1;
    pbVar6 = local_38;
    goto switchD_00105fbc_default;
  case 0xfa:
    local_48 = (uint)*pbVar6 + local_48;
    *(int *)(lVar1 + (long)(int)local_44 * 4) = local_48;
    uVar7 = local_44 + 1;
    pbVar6 = local_38 + 2;
    goto switchD_00105fbc_default;
  case 0xfb:
    local_48 = local_48 + 4;
    pbVar6 = local_38 + 3;
    goto switchD_00105fbc_default;
  case 0xfc:
    local_48 = local_48 + 1;
    pbVar6 = local_38 + 2;
    goto switchD_00105fbc_default;
  case 0xfd:
    local_4c = (uint)local_38[-1];
    goto switchD_00105fbc_default;
  case 0xfe:
    goto switchD_00105fbc_caseD_fe;
  case 0xff:
    goto LAB_00106620;
  default:
    goto switchD_00105fbc_default;
  }
  *(int *)(lVar1 + (long)(int)local_44 * 4) = local_7c;
  *local_78 = local_44;
LAB_00106244:
  local_48 = local_48 + 4;
  if ((bVar3 == 0xf4) || (uVar7 = local_44 + 1, pbVar6 = local_38, bVar3 == 0xf5)) {
    *(int *)(lVar1 + (long)(int)(local_44 + 1) * 4) = local_48;
    uVar7 = local_44 + 2;
    pbVar6 = local_38;
  }
  goto switchD_00105fbc_default;
switchD_00105fbc_caseD_fe:
  if ((int)(uint)*pbVar6 < *(int *)(local_30 + 0x48)) {
    *(long *)(local_30 + 0x38) = local_30 + 0x50 + (long)(int)(uint)*pbVar6 * 0x28;
LAB_00106620:
    *(uint *)(local_40 + 3) = local_44;
    *(int *)(local_40 + 4) = local_48;
  }
  else {
    *(uint *)(local_30 + 0x4c) = (iVar2 - (int)*(undefined8 *)(local_30 + 8)) - 1U | 0x12000000;
  }
  return;
}

Assistant:

void dasm_put(Dst_DECL, int start, ...)
{
  va_list ap;
  dasm_State *D = Dst_REF;
  dasm_ActList p = D->actionlist + start;
  dasm_Section *sec = D->section;
  int pos = sec->pos, ofs = sec->ofs, mrm = -1;
  int *b;

  if (pos >= sec->epos) {
    DASM_M_GROW(Dst, int, sec->buf, sec->bsize,
      sec->bsize + 2*DASM_MAXSECPOS*sizeof(int));
    sec->rbuf = sec->buf - DASM_POS2BIAS(pos);
    sec->epos = (int)sec->bsize/sizeof(int) - DASM_MAXSECPOS+DASM_POS2BIAS(pos);
  }

  b = sec->rbuf;
  b[pos++] = start;

  va_start(ap, start);
  while (1) {
    int action = *p++;
    if (action < DASM_DISP) {
      ofs++;
    } else if (action <= DASM_REL_A) {
      int n = va_arg(ap, int);
      b[pos++] = n;
      switch (action) {
      case DASM_DISP:
	if (n == 0) { if (mrm < 0) mrm = p[-2]; if ((mrm&7) != 5) break; }
	/* fallthrough */
      case DASM_IMM_DB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_REL_A: /* Assumes ptrdiff_t is int. !x64 */
      case DASM_IMM_D: ofs += 4; break;
      case DASM_IMM_S: CK(((n+128)&-256) == 0, RANGE_I); goto ob;
      case DASM_IMM_B: CK((n&-256) == 0, RANGE_I); ob: ofs++; break;
      case DASM_IMM_WB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_IMM_W: CK((n&-65536) == 0, RANGE_I); ofs += 2; break;
      case DASM_SPACE: p++; ofs += n; break;
      case DASM_SETLABEL: b[pos-2] = -0x40000000; break;  /* Neg. label ofs. */
      case DASM_VREG: CK((n&-16) == 0 && (n != 4 || (*p>>5) != 2), RANGE_VREG);
	if (*p < 0x40 && p[1] == DASM_DISP) mrm = n;
	if (*p < 0x20 && (n&7) == 4) ofs++;
	switch ((*p++ >> 3) & 3) {
	case 3: n |= b[pos-3]; /* fallthrough */
	case 2: n |= b[pos-2]; /* fallthrough */
	case 1: if (n <= 7) { b[pos-1] |= 0x10; ofs--; }
	}
	continue;
      }
      mrm = -1;
    } else {
      int *pl, n;
      switch (action) {
      case DASM_REL_LG:
      case DASM_IMM_LG:
	n = *p++; pl = D->lglabels + n;
	/* Bkwd rel or global. */
	if (n <= 246) { CK(n>=10||*pl<0, RANGE_LG); CKPL(lg, LG); goto putrel; }
	pl -= 246; n = *pl;
	if (n < 0) n = 0;  /* Start new chain for fwd rel if label exists. */
	goto linkrel;
      case DASM_REL_PC:
      case DASM_IMM_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putrel:
	n = *pl;
	if (n < 0) {  /* Label exists. Get label pos and store it. */
	  b[pos] = -n;
	} else {
      linkrel:
	  b[pos] = n;  /* Else link to rel chain, anchored at label. */
	  *pl = pos;
	}
	pos++;
	ofs += 4;  /* Maximum offset needed. */
	if (action == DASM_REL_LG || action == DASM_REL_PC)
	  b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_LABEL_LG: pl = D->lglabels + *p++; CKPL(lg, LG); goto putlabel;
      case DASM_LABEL_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putlabel:
	n = *pl;  /* n > 0: Collapse rel chain and replace with label pos. */
	while (n > 0) { int *pb = DASM_POS2PTR(D, n); n = *pb; *pb = pos; }
	*pl = -pos;  /* Label exists now. */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_ALIGN:
	ofs += *p++;  /* Maximum alignment needed (arg is 2**n-1). */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_EXTERN: p += 2; ofs += 4; break;
      case DASM_ESC: p++; ofs++; break;
      case DASM_MARK: mrm = p[-2]; break;
      case DASM_SECTION:
	n = *p; CK(n < D->maxsection, RANGE_SEC); D->section = &D->sections[n];
      case DASM_STOP: goto stop;
      }
    }
  }
stop:
  va_end(ap);
  sec->pos = pos;
  sec->ofs = ofs;
}